

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O1

void __thiscall HighsMipSolverData::printDisplayLine(HighsMipSolverData *this,int solution_source)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  int iVar5;
  HighsOptions *pHVar6;
  bool *__nbytes;
  long lVar7;
  void *in_RDX;
  char *pcVar8;
  HighsMipSolverData *pHVar9;
  uint uVar10;
  double dVar11;
  double extraout_XMM0_Qa;
  double dVar12;
  double ub;
  double dual_bound;
  undefined1 local_130 [16];
  double lb;
  double primal_bound;
  char acStack_110 [16];
  array<char,_22UL> print_nodes;
  string time_string;
  double mip_rel_gap;
  string local_a8;
  array<char,_22UL> print_leaves;
  array<char,_22UL> queue_nodes;
  array<char,_22UL> print_lp_iters;
  array<char,_22UL> lb_string;
  
  pHVar6 = this->mipsolver->options_mip_;
  __nbytes = (pHVar6->super_HighsOptionsStruct).log_options.output_flag;
  if (*__nbytes != true) {
    return;
  }
  bVar4 = (pHVar6->super_HighsOptionsStruct).timeless_log;
  if (bVar4 == true) {
    dVar11 = this->disptime + 1.0;
  }
  else {
    HighsTimer::read(&this->mipsolver->timer_,0,in_RDX,(size_t)__nbytes);
    dVar11 = extraout_XMM0_Qa;
  }
  this->disptime = dVar11;
  if ((solution_source == -1) &&
     (dVar11 - this->last_disptime <
      (this->mipsolver->options_mip_->super_HighsOptionsStruct).mip_min_logging_interval)) {
    return;
  }
  this->last_disptime = dVar11;
  if (bVar4 == false) {
    highsFormatToString_abi_cxx11_(&time_string," %7.1fs");
  }
  else {
    time_string._M_dataplus._M_p = (pointer)&time_string.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&time_string,"");
  }
  lVar7 = this->num_disp_lines * -0x3333333333333333;
  if ((lVar7 + 0x1999999999999998U >> 2 | lVar7 << 0x3e) < 0xccccccccccccccd) {
    if (this->num_disp_lines == 0) {
      printSolutionSourceKey(this);
    }
    pcVar8 = "      Work      ";
    if (bVar4 != false) {
      pcVar8 = "   Work";
    }
    dual_bound = (double)local_130;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&dual_bound,pcVar8,pcVar8 + (ulong)(bVar4 ^ 1) * 9 + 7);
    pcVar8 = "LpIters     Time";
    if (bVar4 != false) {
      pcVar8 = "LpIters";
    }
    print_nodes._M_elems._0_8_ = print_nodes._M_elems + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&print_nodes,pcVar8,pcVar8 + (ulong)(bVar4 ^ 1) * 9 + 7);
    highsLogUser(&(this->mipsolver->options_mip_->super_HighsOptionsStruct).log_options,kInfo,
                 "\n        Nodes      |    B&B Tree     |            Objective Bounds              |  Dynamic Constraints | %s\nSrc  Proc. InQueue |  Leaves   Expl. | BestBound       BestSol              Gap |   Cuts   InLp Confl. | %s\n\n"
                 ,dual_bound,print_nodes._M_elems._0_8_);
    if ((char *)print_nodes._M_elems._0_8_ != print_nodes._M_elems + 0x10) {
      operator_delete((void *)print_nodes._M_elems._0_8_);
    }
    if ((undefined1 *)dual_bound != local_130) {
      operator_delete((void *)dual_bound);
    }
  }
  this->num_disp_lines = this->num_disp_lines + 1;
  convertToPrintString(&print_nodes,this->num_nodes);
  convertToPrintString
            (&queue_nodes,
             ((long)(this->nodequeue).nodes.
                    super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->nodequeue).nodes.
                    super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x71c71c71c71c71c7 -
             (((long)(this->nodequeue).freeslots.c.super__Vector_base<long,_std::allocator<long>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->nodequeue).freeslots.c.super__Vector_base<long,_std::allocator<long>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3) +
             (this->nodequeue).numSuboptimal));
  convertToPrintString(&print_leaves,this->num_leaves - this->num_leaves_before_run);
  dVar11 = (this->pruned_treeweight).hi;
  dVar2 = (this->pruned_treeweight).lo;
  dVar12 = limitsToGap(this,this->lower_bound,this->upper_bound,&lb,&ub);
  dVar3 = (this->mipsolver->options_mip_->super_HighsOptionsStruct).objective_bound;
  if (dVar3 < ub) {
    ub = dVar3;
  }
  convertToPrintString(&print_lp_iters,this->total_lp_iterations);
  iVar5 = (this->lp).lpsolver.model_.lp_.num_row_;
  if (iVar5 < 1) {
    uVar10 = 0;
  }
  else {
    uVar10 = iVar5 - ((this->lp).mipsolver)->model_->num_row_;
  }
  dVar11 = (dVar11 + dVar2) * 100.0;
  if (INFINITY <= this->upper_bound) {
    pdVar1 = &(this->mipsolver->options_mip_->super_HighsOptionsStruct).objective_bound;
    pcVar8 = "*";
    if (ub < *pdVar1 || ub == *pdVar1) {
      pcVar8 = "";
    }
    convertToPrintString
              ((array<char,_22UL> *)&primal_bound,(double)this->mipsolver->orig_model_->sense_ * ub,
               pcVar8);
    pHVar9 = (HighsMipSolverData *)0x3d2f67;
    convertToPrintString
              ((array<char,_22UL> *)&mip_rel_gap,(double)this->mipsolver->orig_model_->sense_ * lb,
               "");
    pHVar6 = this->mipsolver->options_mip_;
    solutionSourceToString_abi_cxx11_((string *)&dual_bound,pHVar9,solution_source,true);
    highsLogUser(&(pHVar6->super_HighsOptionsStruct).log_options,kInfo,
                 " %s %7s %7s   %7s %6.2f%%   %-15s %-15s %8.2f   %6d %6d %6d   %7s%s\n",dVar11,
                 dVar12 * 100.0,dual_bound,&print_nodes,&queue_nodes,&print_leaves,
                 (array<char,_22UL> *)&mip_rel_gap,(array<char,_22UL> *)&primal_bound,
                 (ulong)(uint)((int)((ulong)((long)(this->cutpool).matrix_.ARrange_.
                                                                                                      
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(this->cutpool).matrix_.ARrange_.
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) -
                              (int)((ulong)((long)(this->cutpool).matrix_.deletedrows_.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                           (long)(this->cutpool).matrix_.deletedrows_.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) >> 2)),
                 (ulong)uVar10,
                 (ulong)(uint)((int)((ulong)((long)(this->conflictPool).conflictRanges_.
                                                                                                      
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(this->conflictPool).conflictRanges_.
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) -
                              (int)((ulong)((long)(this->conflictPool).deletedConflicts_.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                           (long)(this->conflictPool).deletedConflicts_.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) >> 2)),
                 &print_lp_iters,time_string._M_dataplus._M_p);
    if ((undefined1 *)dual_bound == local_130) goto LAB_002bfeb1;
  }
  else {
    primal_bound = 0.0;
    acStack_110[0] = '\0';
    acStack_110[1] = '\0';
    acStack_110[2] = '\0';
    acStack_110[3] = '\0';
    acStack_110[4] = '\0';
    acStack_110[5] = '\0';
    acStack_110[6] = '\0';
    acStack_110[7] = '\0';
    acStack_110[8] = '\0';
    acStack_110[9] = '\0';
    acStack_110[10] = '\0';
    acStack_110[0xb] = '\0';
    acStack_110[0xc] = '\0';
    acStack_110[0xd] = '\0';
    if (9999.0 <= dVar12 * 100.0) {
      primal_bound = 2.15179050153524e-312;
    }
    else {
      snprintf((char *)&primal_bound,0x16,"%.2f%%");
    }
    pdVar1 = &(this->mipsolver->options_mip_->super_HighsOptionsStruct).objective_bound;
    pcVar8 = "*";
    if (ub < *pdVar1 || ub == *pdVar1) {
      pcVar8 = "";
    }
    convertToPrintString
              ((array<char,_22UL> *)&mip_rel_gap,(double)this->mipsolver->orig_model_->sense_ * ub,
               pcVar8);
    pHVar9 = (HighsMipSolverData *)0x3d2f67;
    convertToPrintString(&lb_string,(double)this->mipsolver->orig_model_->sense_ * lb,"");
    pHVar6 = this->mipsolver->options_mip_;
    solutionSourceToString_abi_cxx11_((string *)&dual_bound,pHVar9,solution_source,true);
    highsLogUser(&(pHVar6->super_HighsOptionsStruct).log_options,kInfo,
                 " %s %7s %7s   %7s %6.2f%%   %-15s %-15s %8s   %6d %6d %6d   %7s%s\n",dVar11,
                 dual_bound,&print_nodes,&queue_nodes,&print_leaves,&lb_string,&mip_rel_gap,
                 &primal_bound,
                 (ulong)(uint)((int)((ulong)((long)(this->cutpool).matrix_.ARrange_.
                                                                                                      
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(this->cutpool).matrix_.ARrange_.
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) -
                              (int)((ulong)((long)(this->cutpool).matrix_.deletedrows_.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                           (long)(this->cutpool).matrix_.deletedrows_.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) >> 2)),
                 (ulong)uVar10,
                 (ulong)(uint)((int)((ulong)((long)(this->conflictPool).conflictRanges_.
                                                                                                      
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(this->conflictPool).conflictRanges_.
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) -
                              (int)((ulong)((long)(this->conflictPool).deletedConflicts_.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                           (long)(this->conflictPool).deletedConflicts_.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) >> 2)),
                 &print_lp_iters,time_string._M_dataplus._M_p);
    if ((undefined1 *)dual_bound == local_130) goto LAB_002bfeb1;
  }
  operator_delete((void *)dual_bound);
LAB_002bfeb1:
  limitsToBounds(this,&dual_bound,&primal_bound,&mip_rel_gap);
  mip_rel_gap = mip_rel_gap * 100.0;
  HighsCallback::clearHighsCallbackDataOut(this->mipsolver->callback_);
  dVar11 = this->mipsolver->solution_objective_;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"MIP logging","");
  interruptFromCallbackWithData(this,5,dVar11,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)time_string._M_dataplus._M_p != &time_string.field_2) {
    operator_delete(time_string._M_dataplus._M_p);
  }
  return;
}

Assistant:

void HighsMipSolverData::printDisplayLine(const int solution_source) {
  // MIP logging method
  //
  // Note that if the original problem is a maximization, the cost
  // coefficients are negated so that the MIP solver only solves a
  // minimization. Hence, in preparing to print the display line, the
  // dual bound (lb) is always less than the primal bound (ub). When
  // printed, the sense of the optimization is applied so that the
  // values printed correspond to the original objective.

  // No point in computing all the logging values if logging is off
  bool output_flag = *mipsolver.options_mip_->log_options.output_flag;
  if (!output_flag) return;

  bool timeless_log = mipsolver.options_mip_->timeless_log;
  disptime = timeless_log ? disptime + 1 : mipsolver.timer_.read();
  if (solution_source == kSolutionSourceNone &&
      disptime - last_disptime <
          mipsolver.options_mip_->mip_min_logging_interval)
    return;
  last_disptime = disptime;
  std::string time_string =
      timeless_log ? "" : highsFormatToString(" %7.1fs", disptime);

  if (num_disp_lines % 20 == 0) {
    if (num_disp_lines == 0) printSolutionSourceKey();
    std::string work_string0 = timeless_log ? "   Work" : "      Work      ";
    std::string work_string1 = timeless_log ? "LpIters" : "LpIters     Time";
    highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                 // clang-format off
	"\n        Nodes      |    B&B Tree     |            Objective Bounds              |  Dynamic Constraints | %s\n"
	  "Src  Proc. InQueue |  Leaves   Expl. | BestBound       BestSol              Gap |   Cuts   InLp Confl. | %s\n\n",
                 // clang-format on
                 work_string0.c_str(), work_string1.c_str());

    //"   %7s | %10s | %10s | %10s | %10s | %-15s | %-15s | %7s | %7s "
    //"| %8s | %8s\n",
    //"time", "open nodes", "nodes", "leaves", "lpiters", "dual bound",
    //"primal bound", "cutpool", "confl.", "gap", "explored");
  }

  ++num_disp_lines;

  auto print_nodes = convertToPrintString(num_nodes);
  auto queue_nodes = convertToPrintString(nodequeue.numActiveNodes());
  auto print_leaves = convertToPrintString(num_leaves - num_leaves_before_run);

  double explored = 100 * double(pruned_treeweight);

  double lb;
  double ub;
  double gap = limitsToGap(lower_bound, upper_bound, lb, ub);
  gap *= 1e2;
  if (mipsolver.options_mip_->objective_bound < ub)
    ub = mipsolver.options_mip_->objective_bound;

  auto print_lp_iters = convertToPrintString(total_lp_iterations);
  HighsInt dynamic_constraints_in_lp =
      lp.numRows() > 0 ? lp.numRows() - lp.getNumModelRows() : 0;
  if (upper_bound != kHighsInf) {
    std::array<char, 22> gap_string = {};
    if (gap >= 9999.)
      std::strcpy(gap_string.data(), "Large");
    else
      std::snprintf(gap_string.data(), gap_string.size(), "%.2f%%", gap);

    std::array<char, 22> ub_string;
    if (mipsolver.options_mip_->objective_bound < ub) {
      ub_string =
          convertToPrintString((int)mipsolver.orig_model_->sense_ * ub, "*");
    } else
      ub_string = convertToPrintString((int)mipsolver.orig_model_->sense_ * ub);

    auto lb_string =
        convertToPrintString((int)mipsolver.orig_model_->sense_ * lb);

    highsLogUser(
        mipsolver.options_mip_->log_options, HighsLogType::kInfo,
        // clang-format off
                 " %s %7s %7s   %7s %6.2f%%   %-15s %-15s %8s   %6" HIGHSINT_FORMAT " %6" HIGHSINT_FORMAT " %6" HIGHSINT_FORMAT "   %7s%s\n",
        // clang-format on
        solutionSourceToString(solution_source).c_str(), print_nodes.data(),
        queue_nodes.data(), print_leaves.data(), explored, lb_string.data(),
        ub_string.data(), gap_string.data(), cutpool.getNumCuts(),
        dynamic_constraints_in_lp, conflictPool.getNumConflicts(),
        print_lp_iters.data(), time_string.c_str());
  } else {
    std::array<char, 22> ub_string;
    if (mipsolver.options_mip_->objective_bound < ub) {
      ub_string =
          convertToPrintString((int)mipsolver.orig_model_->sense_ * ub, "*");
    } else
      ub_string = convertToPrintString((int)mipsolver.orig_model_->sense_ * ub);

    auto lb_string =
        convertToPrintString((int)mipsolver.orig_model_->sense_ * lb);

    highsLogUser(
        mipsolver.options_mip_->log_options, HighsLogType::kInfo,
        // clang-format off
        " %s %7s %7s   %7s %6.2f%%   %-15s %-15s %8.2f   %6" HIGHSINT_FORMAT " %6" HIGHSINT_FORMAT " %6" HIGHSINT_FORMAT "   %7s%s\n",
        // clang-format on
        solutionSourceToString(solution_source).c_str(), print_nodes.data(),
        queue_nodes.data(), print_leaves.data(), explored, lb_string.data(),
        ub_string.data(), gap, cutpool.getNumCuts(), dynamic_constraints_in_lp,
        conflictPool.getNumConflicts(), print_lp_iters.data(),
        time_string.c_str());
  }
  // Check that limitsToBounds yields the same values for the
  // dual_bound, primal_bound (modulo optimization sense) and
  // mip_rel_gap
  double dual_bound;
  double primal_bound;
  double mip_rel_gap;
  limitsToBounds(dual_bound, primal_bound, mip_rel_gap);
  mip_rel_gap *= 1e2;
  assert(dual_bound == (int)mipsolver.orig_model_->sense_ * lb);
  assert(primal_bound == (int)mipsolver.orig_model_->sense_ * ub);
  assert(gap == mip_rel_gap);

  // Possibly interrupt from MIP logging callback
  mipsolver.callback_->clearHighsCallbackDataOut();
  const bool interrupt = interruptFromCallbackWithData(
      kCallbackMipLogging, mipsolver.solution_objective_, "MIP logging");
  assert(!interrupt);
}